

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::texParameteri
          (ReferenceContext *this,deUint32 target,deUint32 pname,int value)

{
  bool bVar1;
  pointer pTVar2;
  Texture1D *pTVar3;
  FilterMode FVar4;
  WrapMode WVar5;
  pointer pTVar6;
  long lVar7;
  
  pTVar2 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start + this->m_activeTexture;
  if ((int)target < 0x8513) {
    if (target == 0xde0) {
      lVar7 = 0x30;
      pTVar6 = pTVar2;
    }
    else if (target == 0xde1) {
      lVar7 = 0x5e0;
      pTVar6 = (pointer)&pTVar2->tex2DBinding;
    }
    else {
      if (target != 0x806f) goto LAB_009a56f5;
      lVar7 = 0x3158;
      pTVar6 = (pointer)&pTVar2->tex3DBinding;
    }
  }
  else if (target == 0x8513) {
    pTVar6 = (pointer)&pTVar2->texCubeBinding;
    lVar7 = 0xb90;
  }
  else if (target == 0x8c1a) {
    pTVar6 = (pointer)&pTVar2->tex2DArrayBinding;
    lVar7 = 0x2ba8;
  }
  else {
    if (target != 0x9009) goto LAB_009a56f5;
    pTVar6 = (pointer)&pTVar2->texCubeArrayBinding;
    lVar7 = 0x3708;
  }
  pTVar3 = (Texture1D *)((long)&pTVar2->tex1DBinding + lVar7);
  if (pTVar6->tex1DBinding != (Texture1D *)0x0) {
    pTVar3 = pTVar6->tex1DBinding;
  }
  switch(pname) {
  case 0x2800:
    break;
  case 0x2801:
    switch(value) {
    case 0x2700:
      FVar4 = NEAREST_MIPMAP_NEAREST;
      break;
    case 0x2701:
      FVar4 = LINEAR_MIPMAP_NEAREST;
      break;
    case 0x2702:
      FVar4 = NEAREST_MIPMAP_LINEAR;
      break;
    case 0x2703:
      FVar4 = LINEAR_MIPMAP_LINEAR;
      break;
    default:
      if (value == 0x2600) {
        bVar1 = false;
        FVar4 = NEAREST;
      }
      else {
        if (value == 0x2601) {
          FVar4 = LINEAR;
          break;
        }
        FVar4 = FILTERMODE_LAST;
        bVar1 = true;
      }
      goto LAB_009a58a8;
    }
    bVar1 = false;
LAB_009a58a8:
    if (!bVar1) {
      *(FilterMode *)((long)&(pTVar3->super_Texture).m_sampler + 0xc) = FVar4;
      return;
    }
    goto LAB_009a58ac;
  case 0x2802:
    if (value == 0x8370) {
      WVar5 = MIRRORED_REPEAT_GL;
LAB_009a582b:
      bVar1 = false;
    }
    else if (value == 0x812f) {
      bVar1 = false;
      WVar5 = CLAMP_TO_EDGE;
    }
    else {
      if (value == 0x2901) {
        WVar5 = REPEAT_GL;
        goto LAB_009a582b;
      }
      WVar5 = WRAPMODE_LAST;
      bVar1 = true;
    }
    if (!bVar1) {
      (pTVar3->super_Texture).m_sampler.wrapS = WVar5;
      return;
    }
    goto LAB_009a58ac;
  case 0x2803:
    if (value == 0x8370) {
      WVar5 = MIRRORED_REPEAT_GL;
LAB_009a5849:
      bVar1 = false;
    }
    else if (value == 0x812f) {
      bVar1 = false;
      WVar5 = CLAMP_TO_EDGE;
    }
    else {
      if (value == 0x2901) {
        WVar5 = REPEAT_GL;
        goto LAB_009a5849;
      }
      WVar5 = WRAPMODE_LAST;
      bVar1 = true;
    }
    if (!bVar1) {
      *(WrapMode *)((long)&(pTVar3->super_Texture).m_sampler + 4) = WVar5;
      return;
    }
    goto LAB_009a58ac;
  default:
    if (pname != 0x8072) {
      if (pname != 0x813d) {
LAB_009a56f5:
        if (this->m_lastError != 0) {
          return;
        }
        this->m_lastError = 0x500;
        return;
      }
      if (-1 < value) {
        (pTVar3->super_Texture).m_maxLevel = value;
        return;
      }
      goto LAB_009a58ac;
    }
    if (value == 0x8370) {
      WVar5 = MIRRORED_REPEAT_GL;
LAB_009a580f:
      bVar1 = false;
    }
    else if (value == 0x812f) {
      bVar1 = false;
      WVar5 = CLAMP_TO_EDGE;
    }
    else {
      if (value == 0x2901) {
        WVar5 = REPEAT_GL;
        goto LAB_009a580f;
      }
      WVar5 = WRAPMODE_LAST;
      bVar1 = true;
    }
    if (!bVar1) {
      *(WrapMode *)((long)&(pTVar3->super_Texture).m_sampler + 8) = WVar5;
      return;
    }
    goto LAB_009a58ac;
  }
  switch(value) {
  case 0x2700:
    FVar4 = NEAREST_MIPMAP_NEAREST;
    break;
  case 0x2701:
    FVar4 = LINEAR_MIPMAP_NEAREST;
    break;
  case 0x2702:
    FVar4 = NEAREST_MIPMAP_LINEAR;
    break;
  case 0x2703:
    FVar4 = LINEAR_MIPMAP_LINEAR;
    break;
  default:
    bVar1 = true;
    if (value == 0x2600) {
      FVar4 = NEAREST;
    }
    else {
      if (value != 0x2601) {
        FVar4 = FILTERMODE_LAST;
        break;
      }
      FVar4 = LINEAR;
    }
    goto LAB_009a5899;
  }
  bVar1 = false;
LAB_009a5899:
  if (bVar1) {
    *(FilterMode *)((long)&(pTVar3->super_Texture).m_sampler + 0x10) = FVar4;
    return;
  }
LAB_009a58ac:
  if (this->m_lastError != 0) {
    return;
  }
  this->m_lastError = 0x501;
  return;
}

Assistant:

void ReferenceContext::texParameteri (deUint32 target, deUint32 pname, int value)
{
	TextureUnit&	unit		= m_textureUnits[m_activeTexture];
	Texture*		texture		= DE_NULL;

	switch (target)
	{
		case GL_TEXTURE_1D:				texture = unit.tex1DBinding			? unit.tex1DBinding			: &unit.default1DTex;			break;
		case GL_TEXTURE_2D:				texture = unit.tex2DBinding			? unit.tex2DBinding			: &unit.default2DTex;			break;
		case GL_TEXTURE_CUBE_MAP:		texture = unit.texCubeBinding		? unit.texCubeBinding		: &unit.defaultCubeTex;			break;
		case GL_TEXTURE_2D_ARRAY:		texture = unit.tex2DArrayBinding	? unit.tex2DArrayBinding	: &unit.default2DArrayTex;		break;
		case GL_TEXTURE_3D:				texture = unit.tex3DBinding			? unit.tex3DBinding			: &unit.default3DTex;			break;
		case GL_TEXTURE_CUBE_MAP_ARRAY:	texture = unit.texCubeArrayBinding	? unit.texCubeArrayBinding	: &unit.defaultCubeArrayTex;	break;

		default:					RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
	}

	switch (pname)
	{
		case GL_TEXTURE_WRAP_S:
		{
			tcu::Sampler::WrapMode wrapS = mapGLWrapMode(value);
			RC_IF_ERROR(wrapS == tcu::Sampler::WRAPMODE_LAST, GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().wrapS = wrapS;
			break;
		}

		case GL_TEXTURE_WRAP_T:
		{
			tcu::Sampler::WrapMode wrapT = mapGLWrapMode(value);
			RC_IF_ERROR(wrapT == tcu::Sampler::WRAPMODE_LAST, GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().wrapT = wrapT;
			break;
		}

		case GL_TEXTURE_WRAP_R:
		{
			tcu::Sampler::WrapMode wrapR = mapGLWrapMode(value);
			RC_IF_ERROR(wrapR == tcu::Sampler::WRAPMODE_LAST, GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().wrapR = wrapR;
			break;
		}

		case GL_TEXTURE_MIN_FILTER:
		{
			tcu::Sampler::FilterMode minMode = mapGLFilterMode(value);
			RC_IF_ERROR(minMode == tcu::Sampler::FILTERMODE_LAST, GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().minFilter = minMode;
			break;
		}

		case GL_TEXTURE_MAG_FILTER:
		{
			tcu::Sampler::FilterMode magMode = mapGLFilterMode(value);
			RC_IF_ERROR(magMode != tcu::Sampler::LINEAR && magMode != tcu::Sampler::NEAREST,
						GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().magFilter = magMode;
			break;
		}

		case GL_TEXTURE_MAX_LEVEL:
		{
			RC_IF_ERROR(value < 0, GL_INVALID_VALUE, RC_RET_VOID);
			texture->setMaxLevel(value);
			break;
		}

		default:
			RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
	}
}